

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_socket.c
# Opt level: O0

ssize_t send_all(int fd,msghdr *msg,int flags)

{
  uint local_2c;
  long lStack_28;
  uint i;
  ssize_t len;
  int flags_local;
  msghdr *msg_local;
  int fd_local;
  
  lStack_28 = 0;
  for (local_2c = 0; (ulong)local_2c < msg->msg_iovlen; local_2c = local_2c + 1) {
    memcpy(send_buffer + lStack_28,msg->msg_iov[local_2c].iov_base,msg->msg_iov[local_2c].iov_len);
    lStack_28 = msg->msg_iov[local_2c].iov_len + lStack_28;
  }
  return lStack_28;
}

Assistant:

static ssize_t send_all(int fd, const struct msghdr *msg, int flags)
{
	(void)fd;
	(void)flags;
	ssize_t len = 0;
	for (unsigned int i = 0; i < msg->msg_iovlen; i++) {
		memcpy(&send_buffer[len], msg->msg_iov[i].iov_base, msg->msg_iov[i].iov_len);
		len += (ssize_t)msg->msg_iov[i].iov_len;
	}

	return len;
}